

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcurrentStack.h
# Opt level: O0

int __thiscall ConcurrentStack<int>::top(ConcurrentStack<int> *this)

{
  int iVar1;
  bool bVar2;
  ostream *this_00;
  reference pvVar3;
  int local_3c;
  value_type item;
  undefined1 local_20 [8];
  unique_lock<std::mutex> mlock;
  ConcurrentStack<int> *this_local;
  
  mlock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->mutex_);
  while (bVar2 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::empty(&this->stack_),
        bVar2) {
    this_00 = std::operator<<((ostream *)&std::cout,"Can\'t read : queue is empty !");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    local_3c = 0;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&item,&local_3c);
    bVar2 = std::chrono::operator==(&this->timeout_,(duration<long,_std::ratio<1L,_1000L>_> *)&item)
    ;
    if (bVar2) {
      std::condition_variable::wait((unique_lock *)&this->queue_empty_);
    }
    else {
      std::condition_variable::wait_for<long,std::ratio<1l,1000l>>
                (&this->queue_empty_,(unique_lock<std::mutex> *)local_20,&this->timeout_);
    }
  }
  pvVar3 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top(&this->stack_);
  iVar1 = *pvVar3;
  std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_20);
  std::condition_variable::notify_one();
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return iVar1;
}

Assistant:

T top() {
        std::unique_lock<std::mutex> mlock(mutex_);
        while (stack_.empty()){
            std::cout << "Can't read : queue is empty !" << std::endl;
            if(timeout_ == std::chrono::milliseconds(0))
                queue_empty_.wait(mlock);
            else
                queue_empty_.wait_for(mlock, timeout_);
        }
        auto item = stack_.top();
        mlock.unlock();
        queue_full_.notify_one();
        return item;
    }